

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O2

void __thiscall MainWindow::trayIconContextMenu(MainWindow *this)

{
  undefined8 uVar1;
  QMenu *this_00;
  QAction *pQVar2;
  QSettings *pQVar3;
  QSystemTrayIcon *pQVar4;
  QVariant local_90;
  QVariant local_70;
  QObject local_50 [8];
  QFont boldFont;
  QArrayDataPointer<char16_t> local_38;
  
  this_00 = (QMenu *)operator_new(0x28);
  QMenu::QMenu(this_00,(QWidget *)this);
  QString::QString((QString *)&local_70,"Show/Hide Main Window");
  QKeySequence::QKeySequence((QKeySequence *)&local_90);
  pQVar2 = (QAction *)
           QMenu::addAction((QString *)this_00,(QObject *)&local_70,(char *)this,
                            (QKeySequence *)"1showHideMainWindow()");
  this->trayIconMenuShowHideMainWindow = pQVar2;
  QKeySequence::~QKeySequence((QKeySequence *)&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
  QAction::font();
  QFont::setWeight((Weight)&boldFont);
  QAction::setFont((QFont *)this->trayIconMenuShowHideMainWindow);
  QString::QString((QString *)&local_70,"Show/Hide Floating Display");
  QKeySequence::QKeySequence((QKeySequence *)&local_90);
  pQVar2 = (QAction *)
           QMenu::addAction((QString *)this_00,(QObject *)&local_70,(char *)this,
                            (QKeySequence *)"1showHideFloatingDisplay()");
  this->trayIconMenuShowHideFloatingDisplay = pQVar2;
  QKeySequence::~QKeySequence((QKeySequence *)&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
  QString::QString((QString *)&local_70,"Show MIDI Player");
  QKeySequence::QKeySequence((QKeySequence *)&local_90);
  QMenu::addAction((QString *)this_00,(QObject *)&local_70,(char *)this,
                   (QKeySequence *)"1on_actionPlay_MIDI_file_triggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
  QWidget::addAction((QAction *)this_00);
  uVar1 = *(undefined8 *)(this->ui + 0x20);
  pQVar3 = Master::getSettings(this->master);
  QString::QString((QString *)&local_38,"Master/startIconized");
  QVariant::QVariant(&local_90,false);
  QSettings::value((QString *)&local_70,(QVariant *)pQVar3);
  QVariant::toBool();
  QAction::setChecked(SUB81(uVar1,0));
  QVariant::~QVariant(&local_70);
  QVariant::~QVariant(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QString::QString((QString *)&local_70,"Exit");
  QKeySequence::QKeySequence((QKeySequence *)&local_90);
  QMenu::addAction((QString *)this_00,(QObject *)&local_70,(char *)this,
                   (QKeySequence *)"1on_actionExit_triggered()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
  QObject::connect(local_50,(char *)this_00,(QObject *)"2aboutToShow()",(char *)this,0x16e520);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pQVar4 = Master::getTrayIcon(this->master);
  QSystemTrayIcon::setContextMenu((QMenu *)pQVar4);
  QFont::~QFont(&boldFont);
  return;
}

Assistant:

void MainWindow::trayIconContextMenu() {
	QMenu *menu = new QMenu(this);

	trayIconMenuShowHideMainWindow = menu->addAction("Show/Hide Main Window", this, SLOT(showHideMainWindow()));
	QFont boldFont(trayIconMenuShowHideMainWindow->font());
	boldFont.setBold(true);
	trayIconMenuShowHideMainWindow->setFont(boldFont);

	trayIconMenuShowHideFloatingDisplay = menu->addAction("Show/Hide Floating Display", this, SLOT(showHideFloatingDisplay()));

	menu->addAction("Show MIDI Player", this, SLOT(on_actionPlay_MIDI_file_triggered()));

	menu->addAction(ui->actionStart_iconized);
	ui->actionStart_iconized->setChecked(master->getSettings()->value("Master/startIconized", false).toBool());

#ifdef WITH_WINCONSOLE
	QAction *a = menu->addAction("Show console", this, SLOT(toggleShowConsole()));
	a->setCheckable(true);
	a->setChecked(master->getSettings()->value("Master/showConsole", false).toBool());
#endif

	menu->addAction("Exit", this, SLOT(on_actionExit_triggered()));

	connect(menu, SIGNAL(aboutToShow()), SLOT(handleTrayIconMenuAboutToShow()));
	master->getTrayIcon()->setContextMenu(menu);
}